

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O2

void __thiscall ThreadedImageSaver::enqueue(ThreadedImageSaver *this,Image *img,path *path)

{
  std::mutex::lock(&this->mtx);
  std::
  vector<std::pair<Image,std::filesystem::__cxx11::path>,std::allocator<std::pair<Image,std::filesystem::__cxx11::path>>>
  ::emplace_back<Image,std::filesystem::__cxx11::path>
            ((vector<std::pair<Image,std::filesystem::__cxx11::path>,std::allocator<std::pair<Image,std::filesystem::__cxx11::path>>>
              *)&this->images,img,path);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void ThreadedImageSaver::enqueue(Image img, fs::path path) {
	{
		std::lock_guard<std::mutex> l(mtx);
		images.emplace_back(std::move(img), std::move(path));
	}
	cv.notify_one();
}